

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  BVH *bvh;
  size_t sVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  vbool<4> vVar21;
  uint uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  undefined4 uVar25;
  ulong uVar26;
  NodeRef root;
  long lVar27;
  uint uVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  ulong uVar30;
  NodeRef *pNVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM0 [64];
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar58;
  float fVar60;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar59;
  undefined1 auVar56 [64];
  float fVar61;
  float fVar76;
  float fVar77;
  vint4 ai_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar79;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar78;
  float fVar80;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 bi_1;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar100;
  vint4 bi_3;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  vint4 bi;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar115;
  float fVar116;
  vint4 bi_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar117;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar129;
  float fVar130;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar131;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar140;
  undefined1 auVar137 [16];
  float fVar141;
  float fVar142;
  float fVar146;
  float fVar148;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  vint4 ai;
  undefined1 auVar155 [16];
  float fVar160;
  float fVar161;
  float fVar165;
  float fVar166;
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  undefined1 auVar164 [16];
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  vint4 ai_3;
  undefined1 auVar170 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar180 [16];
  float fVar182;
  float fVar184;
  undefined1 auVar181 [64];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_19b8 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  undefined1 local_1838 [8];
  float fStack_1830;
  float fStack_182c;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1800;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint uStack_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar96 [16];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar75 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar42 = vpcmpeqd_avx(auVar75,(undefined1  [16])valid_i->field_0);
    auVar50 = ZEXT816(0) << 0x40;
    auVar11 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar50,5);
    auVar38 = auVar42 & auVar11;
    if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0')
    {
      auVar11 = vandps_avx(auVar11,auVar42);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar123._8_4_ = 0x7fffffff;
      auVar123._0_8_ = 0x7fffffff7fffffff;
      auVar123._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx(auVar123,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar133._8_4_ = 0x219392ef;
      auVar133._0_8_ = 0x219392ef219392ef;
      auVar133._12_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar42,auVar133,1);
      auVar152._8_4_ = 0x3f800000;
      auVar152._0_8_ = &DAT_3f8000003f800000;
      auVar152._12_4_ = 0x3f800000;
      auVar101 = vdivps_avx(auVar152,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar42 = vandps_avx(auVar123,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54 = vcmpps_avx(auVar42,auVar133,1);
      auVar110 = vdivps_avx(auVar152,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar42 = vandps_avx(auVar123,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar42 = vcmpps_avx(auVar42,auVar133,1);
      auVar51 = vdivps_avx(auVar152,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar134._8_4_ = 0x5d5e0b6b;
      auVar134._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar134._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar101,auVar134,auVar38)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar110,auVar134,auVar54)
      ;
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar51,auVar134,auVar42);
      auVar42 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar50,1);
      auVar110._8_4_ = 0x10;
      auVar110._0_8_ = 0x1000000010;
      auVar110._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar42,auVar110);
      auVar42 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar50,5);
      auVar38._8_4_ = 0x20;
      auVar38._0_8_ = 0x2000000020;
      auVar38._12_4_ = 0x20;
      auVar51._8_4_ = 0x30;
      auVar51._0_8_ = 0x3000000030;
      auVar51._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar51,auVar38,auVar42);
      auVar42 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar50,5);
      auVar54._8_4_ = 0x40;
      auVar54._0_8_ = 0x4000000040;
      auVar54._12_4_ = 0x40;
      auVar101._8_4_ = 0x50;
      auVar101._0_8_ = 0x5000000050;
      auVar101._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar101,auVar54,auVar42)
      ;
      auVar42 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar50);
      auVar38 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar50);
      auVar50._8_4_ = 0x7f800000;
      auVar50._0_8_ = 0x7f8000007f800000;
      auVar50._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar42,auVar11);
      auVar56 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar42,auVar38,auVar11);
      terminated.field_0.i[1] = auVar11._4_4_ ^ auVar75._4_4_;
      terminated.field_0.i[0] = auVar11._0_4_ ^ auVar75._0_4_;
      terminated.field_0.i[2] = auVar11._8_4_ ^ auVar75._8_4_;
      terminated.field_0.i[3] = auVar11._12_4_ ^ auVar75._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
      }
      else {
        uVar28 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar31 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_0031eede:
      paVar29 = paVar29 + -1;
      root.ptr = pNVar31[-1].ptr;
      pNVar31 = pNVar31 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0031fb2a;
      aVar5 = *paVar29;
      auVar75 = vcmpps_avx((undefined1  [16])aVar5,(undefined1  [16])tray.tfar.field_0,1);
      uVar22 = vmovmskps_avx(auVar75);
      if (uVar22 == 0) {
LAB_0031fb3b:
        iVar23 = 2;
      }
      else {
        uVar30 = (ulong)(uVar22 & 0xff);
        uVar22 = POPCOUNT(uVar22 & 0xff);
        iVar23 = 0;
        if (uVar22 <= uVar28) {
          do {
            sVar6 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> sVar6 & 1) == 0; sVar6 = sVar6 + 1) {
              }
            }
            auVar56 = ZEXT1664(auVar56._0_16_);
            bVar32 = occluded1(This,bvh,root,sVar6,&pre,ray,&tray,context);
            if (bVar32) {
              terminated.field_0.i[sVar6] = -1;
            }
            uVar30 = uVar30 & uVar30 - 1;
          } while (uVar30 != 0);
          auVar75 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
          iVar23 = 3;
          if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar75[0xf] < '\0') {
            auVar56 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar75._8_4_ = 0xff800000;
            auVar75._0_8_ = 0xff800000ff800000;
            auVar75._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar75,
                               (undefined1  [16])terminated.field_0);
            iVar23 = 2;
          }
        }
        vVar21.field_0 = terminated.field_0;
        auVar181 = ZEXT1664((undefined1  [16])aVar5);
        if (uVar28 < uVar22) {
          do {
            uVar22 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0031fb2a;
              auVar75 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar181._0_16_,6);
              if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar75[0xf]) goto LAB_0031fb3b;
              uVar30 = (ulong)(uVar22 & 0xf);
              auVar75 = vpcmpeqd_avx(auVar75,auVar75);
              if (uVar30 != 8) {
                lVar27 = (root.ptr & 0xfffffffffffffff0) + 0x130;
                uVar24 = 0;
                auVar75 = (undefined1  [16])terminated.field_0 ^ auVar75;
                goto LAB_0031f208;
              }
              auVar75 = vpcmpeqd_avx(auVar56._0_16_,auVar56._0_16_);
              goto LAB_0031faf4;
            }
            uVar24 = root.ptr & 0xfffffffffffffff0;
            auVar75 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar181._0_16_,6);
            auVar181 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar30 = 0;
            root.ptr = 8;
            do {
              sVar6 = *(size_t *)(uVar24 + uVar30 * 8);
              if (sVar6 != 8) {
                fVar2 = *(float *)(uVar24 + 0x80 + uVar30 * 4);
                fVar3 = *(float *)(uVar24 + 0x20 + uVar30 * 4);
                auVar42 = *(undefined1 (*) [16])(ray + 0x70);
                fVar39 = auVar42._0_4_;
                fVar57 = auVar42._4_4_;
                fVar78 = auVar42._8_4_;
                fVar80 = auVar42._12_4_;
                auVar62._0_4_ = fVar39 * fVar2 + fVar3;
                auVar62._4_4_ = fVar57 * fVar2 + fVar3;
                auVar62._8_4_ = fVar78 * fVar2 + fVar3;
                auVar62._12_4_ = fVar80 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar24 + 0xa0 + uVar30 * 4);
                fVar3 = *(float *)(uVar24 + 0x40 + uVar30 * 4);
                auVar81._0_4_ = fVar39 * fVar2 + fVar3;
                auVar81._4_4_ = fVar57 * fVar2 + fVar3;
                auVar81._8_4_ = fVar78 * fVar2 + fVar3;
                auVar81._12_4_ = fVar80 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar24 + 0xc0 + uVar30 * 4);
                fVar3 = *(float *)(uVar24 + 0x60 + uVar30 * 4);
                auVar91._0_4_ = fVar39 * fVar2 + fVar3;
                auVar91._4_4_ = fVar57 * fVar2 + fVar3;
                auVar91._8_4_ = fVar78 * fVar2 + fVar3;
                auVar91._12_4_ = fVar80 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar24 + 0x90 + uVar30 * 4);
                fVar3 = *(float *)(uVar24 + 0x30 + uVar30 * 4);
                auVar102._0_4_ = fVar39 * fVar2 + fVar3;
                auVar102._4_4_ = fVar57 * fVar2 + fVar3;
                auVar102._8_4_ = fVar78 * fVar2 + fVar3;
                auVar102._12_4_ = fVar80 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar24 + 0xb0 + uVar30 * 4);
                fVar3 = *(float *)(uVar24 + 0x50 + uVar30 * 4);
                auVar111._0_4_ = fVar39 * fVar2 + fVar3;
                auVar111._4_4_ = fVar57 * fVar2 + fVar3;
                auVar111._8_4_ = fVar78 * fVar2 + fVar3;
                auVar111._12_4_ = fVar80 * fVar2 + fVar3;
                fVar2 = *(float *)(uVar24 + 0xd0 + uVar30 * 4);
                fVar3 = *(float *)(uVar24 + 0x70 + uVar30 * 4);
                auVar118._0_4_ = fVar3 + fVar39 * fVar2;
                auVar118._4_4_ = fVar3 + fVar57 * fVar2;
                auVar118._8_4_ = fVar3 + fVar78 * fVar2;
                auVar118._12_4_ = fVar3 + fVar80 * fVar2;
                auVar17._8_8_ = tray.org.field_0._8_8_;
                auVar17._0_8_ = tray.org.field_0._0_8_;
                auVar18._8_8_ = tray.org.field_0._24_8_;
                auVar18._0_8_ = tray.org.field_0._16_8_;
                auVar19._8_8_ = tray.org.field_0._40_8_;
                auVar19._0_8_ = tray.org.field_0._32_8_;
                auVar38 = vsubps_avx(auVar62,auVar17);
                auVar155._0_4_ = tray.rdir.field_0._0_4_ * auVar38._0_4_;
                auVar155._4_4_ = tray.rdir.field_0._4_4_ * auVar38._4_4_;
                auVar155._8_4_ = tray.rdir.field_0._8_4_ * auVar38._8_4_;
                auVar155._12_4_ = tray.rdir.field_0._12_4_ * auVar38._12_4_;
                auVar38 = vsubps_avx(auVar81,auVar18);
                auVar162._0_4_ = auVar38._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar162._4_4_ = auVar38._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar162._8_4_ = auVar38._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar162._12_4_ = auVar38._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar38 = vsubps_avx(auVar91,auVar19);
                auVar170._0_4_ = auVar38._0_4_ * (float)tray.rdir.field_0._32_4_;
                auVar170._4_4_ = auVar38._4_4_ * (float)tray.rdir.field_0._36_4_;
                auVar170._8_4_ = auVar38._8_4_ * (float)tray.rdir.field_0._40_4_;
                auVar170._12_4_ = auVar38._12_4_ * (float)tray.rdir.field_0._44_4_;
                auVar38 = vsubps_avx(auVar102,auVar17);
                auVar103._0_4_ = tray.rdir.field_0._0_4_ * auVar38._0_4_;
                auVar103._4_4_ = tray.rdir.field_0._4_4_ * auVar38._4_4_;
                auVar103._8_4_ = tray.rdir.field_0._8_4_ * auVar38._8_4_;
                auVar103._12_4_ = tray.rdir.field_0._12_4_ * auVar38._12_4_;
                auVar38 = vsubps_avx(auVar111,auVar18);
                auVar82._0_4_ = auVar38._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar82._4_4_ = auVar38._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar82._8_4_ = auVar38._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar82._12_4_ = auVar38._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar38 = vsubps_avx(auVar118,auVar19);
                auVar92._0_4_ = auVar38._0_4_ * (float)tray.rdir.field_0._32_4_;
                auVar92._4_4_ = auVar38._4_4_ * (float)tray.rdir.field_0._36_4_;
                auVar92._8_4_ = auVar38._8_4_ * (float)tray.rdir.field_0._40_4_;
                auVar92._12_4_ = auVar38._12_4_ * (float)tray.rdir.field_0._44_4_;
                auVar38 = vpminsd_avx(auVar155,auVar103);
                auVar50 = vpminsd_avx(auVar162,auVar82);
                auVar38 = vpmaxsd_avx(auVar38,auVar50);
                auVar50 = vpminsd_avx(auVar170,auVar92);
                auVar38 = vpmaxsd_avx(auVar38,auVar50);
                auVar63._0_4_ = auVar38._0_4_ * 0.99999964;
                auVar63._4_4_ = auVar38._4_4_ * 0.99999964;
                auVar63._8_4_ = auVar38._8_4_ * 0.99999964;
                auVar63._12_4_ = auVar38._12_4_ * 0.99999964;
                auVar38 = vpmaxsd_avx(auVar155,auVar103);
                auVar50 = vpmaxsd_avx(auVar162,auVar82);
                auVar50 = vpminsd_avx(auVar38,auVar50);
                auVar38 = vpmaxsd_avx(auVar170,auVar92);
                auVar50 = vpminsd_avx(auVar50,auVar38);
                auVar38 = vpmaxsd_avx(auVar63,(undefined1  [16])tray.tnear.field_0);
                auVar93._0_4_ = auVar50._0_4_ * 1.0000004;
                auVar93._4_4_ = auVar50._4_4_ * 1.0000004;
                auVar93._8_4_ = auVar50._8_4_ * 1.0000004;
                auVar93._12_4_ = auVar50._12_4_ * 1.0000004;
                auVar50 = vpminsd_avx(auVar93,(undefined1  [16])tray.tfar.field_0);
                if ((uVar22 & 7) == 6) {
                  auVar38 = vcmpps_avx(auVar38,auVar50,2);
                  uVar25 = *(undefined4 *)(uVar24 + 0xe0 + uVar30 * 4);
                  auVar94._4_4_ = uVar25;
                  auVar94._0_4_ = uVar25;
                  auVar94._8_4_ = uVar25;
                  auVar94._12_4_ = uVar25;
                  auVar50 = vcmpps_avx(auVar94,auVar42,2);
                  uVar25 = *(undefined4 *)(uVar24 + 0xf0 + uVar30 * 4);
                  auVar104._4_4_ = uVar25;
                  auVar104._0_4_ = uVar25;
                  auVar104._8_4_ = uVar25;
                  auVar104._12_4_ = uVar25;
                  auVar42 = vcmpps_avx(auVar42,auVar104,1);
                  auVar42 = vandps_avx(auVar50,auVar42);
                  auVar42 = vandps_avx(auVar42,auVar38);
                }
                else {
                  auVar42 = vcmpps_avx(auVar38,auVar50,2);
                }
                auVar42 = vandps_avx(auVar42,auVar75);
                auVar42 = vpslld_avx(auVar42,0x1f);
                auVar56 = ZEXT1664(auVar42);
                if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar42[0xf] < '\0') {
                  auVar83._8_4_ = 0x7f800000;
                  auVar83._0_8_ = 0x7f8000007f800000;
                  auVar83._12_4_ = 0x7f800000;
                  auVar42 = vblendvps_avx(auVar83,auVar63,auVar42);
                  auVar56 = ZEXT1664(auVar42);
                  if (root.ptr != 8) {
                    pNVar31->ptr = root.ptr;
                    pNVar31 = pNVar31 + 1;
                    *paVar29 = auVar181._0_16_;
                    paVar29 = paVar29 + 1;
                  }
                  auVar181 = ZEXT1664(auVar42);
                  root.ptr = sVar6;
                }
              }
            } while ((sVar6 != 8) && (bVar32 = uVar30 < 3, uVar30 = uVar30 + 1, bVar32));
            iVar23 = 0;
            if (root.ptr == 8) {
LAB_0031f1ad:
              bVar32 = false;
              iVar23 = 4;
            }
            else {
              auVar75 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                   (undefined1  [16])auVar181._0_16_,6);
              uVar25 = vmovmskps_avx(auVar75);
              bVar32 = true;
              if ((uint)POPCOUNT(uVar25) <= uVar28) {
                pNVar31->ptr = root.ptr;
                pNVar31 = pNVar31 + 1;
                *paVar29 = auVar181._0_16_;
                paVar29 = paVar29 + 1;
                goto LAB_0031f1ad;
              }
            }
          } while (bVar32);
        }
      }
      goto LAB_0031fb2d;
    }
  }
  return;
  while( true ) {
    uVar24 = uVar24 + 1;
    lVar27 = lVar27 + 0x140;
    auVar75 = auVar38;
    if (uVar30 - 8 <= uVar24) break;
LAB_0031f208:
    uVar26 = 0;
    auVar42 = auVar75;
    while( true ) {
      uVar22 = *(uint *)(lVar27 + -0x10 + uVar26 * 4);
      if ((ulong)uVar22 == 0xffffffff) break;
      fVar9 = *(float *)(ray + 0x70);
      fVar10 = *(float *)(ray + 0x74);
      fVar41 = *(float *)(ray + 0x78);
      fVar109 = *(float *)(ray + 0x7c);
      fVar2 = *(float *)(lVar27 + -0xa0 + uVar26 * 4);
      fVar3 = *(float *)(lVar27 + -0x90 + uVar26 * 4);
      fVar39 = *(float *)(lVar27 + -0x80 + uVar26 * 4);
      fVar57 = *(float *)(lVar27 + -0x130 + uVar26 * 4);
      fVar78 = *(float *)(lVar27 + -0x120 + uVar26 * 4);
      fVar80 = *(float *)(lVar27 + -0x110 + uVar26 * 4);
      auVar43._0_4_ = fVar9 * fVar2 + fVar57;
      auVar43._4_4_ = fVar10 * fVar2 + fVar57;
      auVar43._8_4_ = fVar41 * fVar2 + fVar57;
      auVar43._12_4_ = fVar109 * fVar2 + fVar57;
      auVar64._0_4_ = fVar9 * fVar3 + fVar78;
      auVar64._4_4_ = fVar10 * fVar3 + fVar78;
      auVar64._8_4_ = fVar41 * fVar3 + fVar78;
      auVar64._12_4_ = fVar109 * fVar3 + fVar78;
      auVar84._0_4_ = fVar9 * fVar39 + fVar80;
      auVar84._4_4_ = fVar10 * fVar39 + fVar80;
      auVar84._8_4_ = fVar41 * fVar39 + fVar80;
      auVar84._12_4_ = fVar109 * fVar39 + fVar80;
      fVar2 = *(float *)(lVar27 + -0x70 + uVar26 * 4);
      fVar3 = *(float *)(lVar27 + -0x60 + uVar26 * 4);
      fVar39 = *(float *)(lVar27 + -0x50 + uVar26 * 4);
      fVar57 = *(float *)(lVar27 + -0x100 + uVar26 * 4);
      fVar78 = *(float *)(lVar27 + -0xf0 + uVar26 * 4);
      fVar80 = *(float *)(lVar27 + -0xe0 + uVar26 * 4);
      auVar95._0_4_ = fVar9 * fVar2 + fVar57;
      auVar95._4_4_ = fVar10 * fVar2 + fVar57;
      auVar95._8_4_ = fVar41 * fVar2 + fVar57;
      auVar95._12_4_ = fVar109 * fVar2 + fVar57;
      auVar105._0_4_ = fVar78 + fVar9 * fVar3;
      auVar105._4_4_ = fVar78 + fVar10 * fVar3;
      auVar105._8_4_ = fVar78 + fVar41 * fVar3;
      auVar105._12_4_ = fVar78 + fVar109 * fVar3;
      auVar112._0_4_ = fVar80 + fVar9 * fVar39;
      auVar112._4_4_ = fVar80 + fVar10 * fVar39;
      auVar112._8_4_ = fVar80 + fVar41 * fVar39;
      auVar112._12_4_ = fVar80 + fVar109 * fVar39;
      fVar2 = *(float *)(lVar27 + -0x40 + uVar26 * 4);
      fVar3 = *(float *)(lVar27 + -0x30 + uVar26 * 4);
      fVar39 = *(float *)(lVar27 + -0x20 + uVar26 * 4);
      fVar57 = *(float *)(lVar27 + -0xd0 + uVar26 * 4);
      fVar78 = *(float *)(lVar27 + -0xc0 + uVar26 * 4);
      fVar80 = *(float *)(lVar27 + -0xb0 + uVar26 * 4);
      auVar163._0_4_ = fVar57 + fVar9 * fVar2;
      auVar163._4_4_ = fVar57 + fVar10 * fVar2;
      auVar163._8_4_ = fVar57 + fVar41 * fVar2;
      auVar163._12_4_ = fVar57 + fVar109 * fVar2;
      auVar124._0_4_ = fVar3 * fVar9 + fVar78;
      auVar124._4_4_ = fVar3 * fVar10 + fVar78;
      auVar124._8_4_ = fVar3 * fVar41 + fVar78;
      auVar124._12_4_ = fVar3 * fVar109 + fVar78;
      auVar135._0_4_ = fVar80 + fVar39 * fVar9;
      auVar135._4_4_ = fVar80 + fVar39 * fVar10;
      auVar135._8_4_ = fVar80 + fVar39 * fVar41;
      auVar135._12_4_ = fVar80 + fVar39 * fVar109;
      auVar38 = *(undefined1 (*) [16])ray;
      auVar50 = *(undefined1 (*) [16])(ray + 0x10);
      auVar54 = *(undefined1 (*) [16])(ray + 0x20);
      auVar101 = vsubps_avx(auVar43,auVar38);
      auVar110 = vsubps_avx(auVar64,auVar50);
      auVar51 = vsubps_avx(auVar84,auVar54);
      auVar123 = vsubps_avx(auVar95,auVar38);
      auVar133 = vsubps_avx(auVar105,auVar50);
      auVar134 = vsubps_avx(auVar112,auVar54);
      auVar152 = vsubps_avx(auVar163,auVar38);
      auVar50 = vsubps_avx(auVar124,auVar50);
      auVar54 = vsubps_avx(auVar135,auVar54);
      auVar38 = vsubps_avx(auVar152,auVar101);
      auVar33 = vsubps_avx(auVar50,auVar110);
      auVar34 = vsubps_avx(auVar54,auVar51);
      fVar2 = auVar110._0_4_;
      fVar109 = auVar50._0_4_ + fVar2;
      fVar39 = auVar110._4_4_;
      fVar115 = auVar50._4_4_ + fVar39;
      fVar78 = auVar110._8_4_;
      fVar116 = auVar50._8_4_ + fVar78;
      fVar9 = auVar110._12_4_;
      fVar117 = auVar50._12_4_ + fVar9;
      fVar177 = auVar51._0_4_;
      fVar122 = fVar177 + auVar54._0_4_;
      fVar182 = auVar51._4_4_;
      fVar129 = fVar182 + auVar54._4_4_;
      fVar184 = auVar51._8_4_;
      fVar130 = fVar184 + auVar54._8_4_;
      fVar186 = auVar51._12_4_;
      fVar131 = fVar186 + auVar54._12_4_;
      fVar41 = auVar34._0_4_;
      auVar136._0_4_ = fVar109 * fVar41;
      fVar12 = auVar34._4_4_;
      auVar136._4_4_ = fVar115 * fVar12;
      fVar13 = auVar34._8_4_;
      auVar136._8_4_ = fVar116 * fVar13;
      fVar14 = auVar34._12_4_;
      auVar136._12_4_ = fVar117 * fVar14;
      fVar168 = auVar33._0_4_;
      auVar143._0_4_ = fVar168 * fVar122;
      fVar171 = auVar33._4_4_;
      auVar143._4_4_ = fVar171 * fVar129;
      fVar173 = auVar33._8_4_;
      auVar143._8_4_ = fVar173 * fVar130;
      fVar175 = auVar33._12_4_;
      auVar143._12_4_ = fVar175 * fVar131;
      auVar33 = vsubps_avx(auVar143,auVar136);
      fVar3 = auVar101._0_4_;
      fVar132 = auVar152._0_4_ + fVar3;
      fVar57 = auVar101._4_4_;
      fVar138 = auVar152._4_4_ + fVar57;
      fVar80 = auVar101._8_4_;
      fVar139 = auVar152._8_4_ + fVar80;
      fVar10 = auVar101._12_4_;
      fVar140 = auVar152._12_4_ + fVar10;
      fVar161 = auVar38._0_4_;
      auVar125._0_4_ = fVar161 * fVar122;
      fVar165 = auVar38._4_4_;
      auVar125._4_4_ = fVar165 * fVar129;
      fVar166 = auVar38._8_4_;
      auVar125._8_4_ = fVar166 * fVar130;
      fVar167 = auVar38._12_4_;
      auVar125._12_4_ = fVar167 * fVar131;
      auVar144._0_4_ = fVar132 * fVar41;
      auVar144._4_4_ = fVar138 * fVar12;
      auVar144._8_4_ = fVar139 * fVar13;
      auVar144._12_4_ = fVar140 * fVar14;
      auVar34 = vsubps_avx(auVar144,auVar125);
      auVar126._0_4_ = fVar132 * fVar168;
      auVar126._4_4_ = fVar138 * fVar171;
      auVar126._8_4_ = fVar139 * fVar173;
      auVar126._12_4_ = fVar140 * fVar175;
      auVar113._0_4_ = fVar161 * fVar109;
      auVar113._4_4_ = fVar165 * fVar115;
      auVar113._8_4_ = fVar166 * fVar116;
      auVar113._12_4_ = fVar167 * fVar117;
      auVar43 = vsubps_avx(auVar113,auVar126);
      auVar38 = *(undefined1 (*) [16])(ray + 0x60);
      fVar109 = auVar38._0_4_;
      fVar117 = auVar38._4_4_;
      fVar130 = auVar38._8_4_;
      fVar138 = auVar38._12_4_;
      auVar38 = *(undefined1 (*) [16])(ray + 0x50);
      fVar169 = auVar38._0_4_;
      fVar172 = auVar38._4_4_;
      fVar174 = auVar38._8_4_;
      fVar176 = auVar38._12_4_;
      auVar20 = *(undefined1 (*) [12])(ray + 0x40);
      fVar16 = *(float *)(ray + 0x4c);
      fVar90 = auVar33._0_4_ * *(float *)(ray + 0x40) +
               fVar169 * auVar34._0_4_ + auVar43._0_4_ * fVar109;
      fVar100 = auVar33._4_4_ * *(float *)(ray + 0x44) +
                fVar172 * auVar34._4_4_ + auVar43._4_4_ * fVar117;
      auVar96._0_8_ = CONCAT44(fVar100,fVar90);
      auVar96._8_4_ =
           auVar33._8_4_ * *(float *)(ray + 0x48) +
           fVar174 * auVar34._8_4_ + auVar43._8_4_ * fVar130;
      auVar96._12_4_ = auVar33._12_4_ * fVar16 + fVar176 * auVar34._12_4_ + auVar43._12_4_ * fVar138
      ;
      auVar38 = vsubps_avx(auVar110,auVar133);
      auVar110 = vsubps_avx(auVar51,auVar134);
      fVar116 = auVar133._0_4_ + fVar2;
      fVar129 = auVar133._4_4_ + fVar39;
      fVar132 = auVar133._8_4_ + fVar78;
      fVar140 = auVar133._12_4_ + fVar9;
      fVar178 = fVar177 + auVar134._0_4_;
      fVar183 = fVar182 + auVar134._4_4_;
      fVar185 = fVar184 + auVar134._8_4_;
      fVar187 = fVar186 + auVar134._12_4_;
      fVar115 = auVar110._0_4_;
      auVar164._0_4_ = fVar116 * fVar115;
      fVar122 = auVar110._4_4_;
      auVar164._4_4_ = fVar129 * fVar122;
      fVar131 = auVar110._8_4_;
      auVar164._8_4_ = fVar132 * fVar131;
      fVar139 = auVar110._12_4_;
      auVar164._12_4_ = fVar140 * fVar139;
      fVar141 = auVar38._0_4_;
      auVar65._0_4_ = fVar141 * fVar178;
      fVar146 = auVar38._4_4_;
      auVar65._4_4_ = fVar146 * fVar183;
      fVar148 = auVar38._8_4_;
      auVar65._8_4_ = fVar148 * fVar185;
      fVar150 = auVar38._12_4_;
      auVar65._12_4_ = fVar150 * fVar187;
      auVar38 = vsubps_avx(auVar65,auVar164);
      auVar101 = vsubps_avx(auVar101,auVar123);
      fVar153 = auVar101._0_4_;
      auVar180._0_4_ = fVar153 * fVar178;
      fVar156 = auVar101._4_4_;
      auVar180._4_4_ = fVar156 * fVar183;
      fVar158 = auVar101._8_4_;
      auVar180._8_4_ = fVar158 * fVar185;
      fVar160 = auVar101._12_4_;
      auVar180._12_4_ = fVar160 * fVar187;
      fVar178 = auVar123._0_4_ + fVar3;
      fVar183 = auVar123._4_4_ + fVar57;
      fVar185 = auVar123._8_4_ + fVar80;
      fVar187 = auVar123._12_4_ + fVar10;
      auVar127._0_4_ = fVar178 * fVar115;
      auVar127._4_4_ = fVar183 * fVar122;
      auVar127._8_4_ = fVar185 * fVar131;
      auVar127._12_4_ = fVar187 * fVar139;
      auVar101 = vsubps_avx(auVar127,auVar180);
      auVar119._0_4_ = fVar141 * fVar178;
      auVar119._4_4_ = fVar146 * fVar183;
      auVar119._8_4_ = fVar148 * fVar185;
      auVar119._12_4_ = fVar150 * fVar187;
      auVar114._0_4_ = fVar153 * fVar116;
      auVar114._4_4_ = fVar156 * fVar129;
      auVar114._8_4_ = fVar158 * fVar132;
      auVar114._12_4_ = fVar160 * fVar140;
      auVar110 = vsubps_avx(auVar114,auVar119);
      fVar154 = auVar20._0_4_;
      fVar157 = auVar20._4_4_;
      fVar159 = auVar20._8_4_;
      auVar120._0_4_ = fVar154 * auVar38._0_4_ + auVar110._0_4_ * fVar109 + fVar169 * auVar101._0_4_
      ;
      auVar120._4_4_ = fVar157 * auVar38._4_4_ + auVar110._4_4_ * fVar117 + fVar172 * auVar101._4_4_
      ;
      auVar120._8_4_ = fVar159 * auVar38._8_4_ + auVar110._8_4_ * fVar130 + fVar174 * auVar101._8_4_
      ;
      auVar120._12_4_ =
           fVar16 * auVar38._12_4_ + auVar110._12_4_ * fVar138 + fVar176 * auVar101._12_4_;
      auVar38 = vsubps_avx(auVar123,auVar152);
      fVar40 = auVar123._0_4_ + auVar152._0_4_;
      fVar58 = auVar123._4_4_ + auVar152._4_4_;
      fVar59 = auVar123._8_4_ + auVar152._8_4_;
      fVar60 = auVar123._12_4_ + auVar152._12_4_;
      auVar101 = vsubps_avx(auVar133,auVar50);
      fVar178 = auVar50._0_4_ + auVar133._0_4_;
      fVar183 = auVar50._4_4_ + auVar133._4_4_;
      fVar185 = auVar50._8_4_ + auVar133._8_4_;
      fVar187 = auVar50._12_4_ + auVar133._12_4_;
      auVar50 = vsubps_avx(auVar134,auVar54);
      fVar61 = auVar134._0_4_ + auVar54._0_4_;
      fVar76 = auVar134._4_4_ + auVar54._4_4_;
      fVar77 = auVar134._8_4_ + auVar54._8_4_;
      fVar79 = auVar134._12_4_ + auVar54._12_4_;
      auVar137._8_4_ = 0x7fffffff;
      auVar137._0_8_ = 0x7fffffff7fffffff;
      auVar137._12_4_ = 0x7fffffff;
      fVar116 = auVar50._0_4_;
      auVar85._0_4_ = fVar178 * fVar116;
      fVar129 = auVar50._4_4_;
      auVar85._4_4_ = fVar183 * fVar129;
      fVar132 = auVar50._8_4_;
      auVar85._8_4_ = fVar185 * fVar132;
      fVar140 = auVar50._12_4_;
      auVar85._12_4_ = fVar187 * fVar140;
      fVar142 = auVar101._0_4_;
      auVar106._0_4_ = fVar142 * fVar61;
      fVar147 = auVar101._4_4_;
      auVar106._4_4_ = fVar147 * fVar76;
      fVar149 = auVar101._8_4_;
      auVar106._8_4_ = fVar149 * fVar77;
      fVar151 = auVar101._12_4_;
      auVar106._12_4_ = fVar151 * fVar79;
      auVar50 = vsubps_avx(auVar106,auVar85);
      fVar179 = auVar38._0_4_;
      auVar66._0_4_ = fVar179 * fVar61;
      fVar61 = auVar38._4_4_;
      auVar66._4_4_ = fVar61 * fVar76;
      fVar76 = auVar38._8_4_;
      auVar66._8_4_ = fVar76 * fVar77;
      fVar77 = auVar38._12_4_;
      auVar66._12_4_ = fVar77 * fVar79;
      auVar107._0_4_ = fVar40 * fVar116;
      auVar107._4_4_ = fVar58 * fVar129;
      auVar107._8_4_ = fVar59 * fVar132;
      auVar107._12_4_ = fVar60 * fVar140;
      auVar38 = vsubps_avx(auVar107,auVar66);
      auVar44._0_4_ = fVar142 * fVar40;
      auVar44._4_4_ = fVar147 * fVar58;
      auVar44._8_4_ = fVar149 * fVar59;
      auVar44._12_4_ = fVar151 * fVar60;
      auVar33._0_4_ = fVar179 * fVar178;
      auVar33._4_4_ = fVar61 * fVar183;
      auVar33._8_4_ = fVar76 * fVar185;
      auVar33._12_4_ = fVar77 * fVar187;
      auVar54 = vsubps_avx(auVar33,auVar44);
      auVar34._0_4_ = fVar154 * auVar50._0_4_ + fVar109 * auVar54._0_4_ + fVar169 * auVar38._0_4_;
      auVar34._4_4_ = fVar157 * auVar50._4_4_ + fVar117 * auVar54._4_4_ + fVar172 * auVar38._4_4_;
      auVar34._8_4_ = fVar159 * auVar50._8_4_ + fVar130 * auVar54._8_4_ + fVar174 * auVar38._8_4_;
      auVar34._12_4_ = fVar16 * auVar50._12_4_ + fVar138 * auVar54._12_4_ + fVar176 * auVar38._12_4_
      ;
      auVar145._0_4_ = auVar34._0_4_ + fVar90 + auVar120._0_4_;
      auVar145._4_4_ = auVar34._4_4_ + fVar100 + auVar120._4_4_;
      auVar145._8_4_ = auVar34._8_4_ + auVar96._8_4_ + auVar120._8_4_;
      auVar145._12_4_ = auVar34._12_4_ + auVar96._12_4_ + auVar120._12_4_;
      auVar38 = vandps_avx(auVar145,auVar137);
      auVar45._0_4_ = auVar38._0_4_ * 1.1920929e-07;
      auVar45._4_4_ = auVar38._4_4_ * 1.1920929e-07;
      auVar45._8_4_ = auVar38._8_4_ * 1.1920929e-07;
      auVar45._12_4_ = auVar38._12_4_ * 1.1920929e-07;
      auVar38 = vminps_avx(auVar96,auVar120);
      auVar38 = vminps_avx(auVar38,auVar34);
      uVar15 = CONCAT44(auVar45._4_4_,auVar45._0_4_);
      auVar86._0_8_ = uVar15 ^ 0x8000000080000000;
      auVar86._8_4_ = -auVar45._8_4_;
      auVar86._12_4_ = -auVar45._12_4_;
      auVar38 = vcmpps_avx(auVar38,auVar86,5);
      auVar50 = vmaxps_avx(auVar96,auVar120);
      auVar50 = vmaxps_avx(auVar50,auVar34);
      auVar50 = vcmpps_avx(auVar50,auVar45,2);
      auVar38 = vorps_avx(auVar38,auVar50);
      auVar50 = auVar42 & auVar38;
      auVar38 = vandps_avx(auVar38,auVar42);
      if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar50[0xf] < '\0'
         ) {
        auVar35._0_4_ = fVar141 * fVar41;
        auVar35._4_4_ = fVar146 * fVar12;
        auVar35._8_4_ = fVar148 * fVar13;
        auVar35._12_4_ = fVar150 * fVar14;
        auVar46._0_4_ = fVar168 * fVar115;
        auVar46._4_4_ = fVar171 * fVar122;
        auVar46._8_4_ = fVar173 * fVar131;
        auVar46._12_4_ = fVar175 * fVar139;
        auVar101 = vsubps_avx(auVar46,auVar35);
        auVar67._0_4_ = fVar142 * fVar115;
        auVar67._4_4_ = fVar147 * fVar122;
        auVar67._8_4_ = fVar149 * fVar131;
        auVar67._12_4_ = fVar151 * fVar139;
        auVar87._0_4_ = fVar141 * fVar116;
        auVar87._4_4_ = fVar146 * fVar129;
        auVar87._8_4_ = fVar148 * fVar132;
        auVar87._12_4_ = fVar150 * fVar140;
        auVar110 = vsubps_avx(auVar87,auVar67);
        auVar50 = vandps_avx(auVar137,auVar35);
        auVar54 = vandps_avx(auVar137,auVar67);
        auVar50 = vcmpps_avx(auVar50,auVar54,1);
        auVar101 = vblendvps_avx(auVar110,auVar101,auVar50);
        auVar36._0_4_ = fVar153 * fVar116;
        auVar36._4_4_ = fVar156 * fVar129;
        auVar36._8_4_ = fVar158 * fVar132;
        auVar36._12_4_ = fVar160 * fVar140;
        auVar47._0_4_ = fVar153 * fVar41;
        auVar47._4_4_ = fVar156 * fVar12;
        auVar47._8_4_ = fVar158 * fVar13;
        auVar47._12_4_ = fVar160 * fVar14;
        auVar68._0_4_ = fVar161 * fVar115;
        auVar68._4_4_ = fVar165 * fVar122;
        auVar68._8_4_ = fVar166 * fVar131;
        auVar68._12_4_ = fVar167 * fVar139;
        auVar110 = vsubps_avx(auVar47,auVar68);
        auVar97._0_4_ = fVar179 * fVar115;
        auVar97._4_4_ = fVar61 * fVar122;
        auVar97._8_4_ = fVar76 * fVar131;
        auVar97._12_4_ = fVar77 * fVar139;
        auVar51 = vsubps_avx(auVar97,auVar36);
        auVar50 = vandps_avx(auVar137,auVar68);
        auVar54 = vandps_avx(auVar137,auVar36);
        auVar50 = vcmpps_avx(auVar50,auVar54,1);
        auVar110 = vblendvps_avx(auVar51,auVar110,auVar50);
        auVar48._0_4_ = fVar179 * fVar141;
        auVar48._4_4_ = fVar61 * fVar146;
        auVar48._8_4_ = fVar76 * fVar148;
        auVar48._12_4_ = fVar77 * fVar150;
        auVar69._0_4_ = fVar141 * fVar161;
        auVar69._4_4_ = fVar146 * fVar165;
        auVar69._8_4_ = fVar148 * fVar166;
        auVar69._12_4_ = fVar150 * fVar167;
        auVar98._0_4_ = fVar153 * fVar168;
        auVar98._4_4_ = fVar156 * fVar171;
        auVar98._8_4_ = fVar158 * fVar173;
        auVar98._12_4_ = fVar160 * fVar175;
        auVar108._0_4_ = fVar153 * fVar142;
        auVar108._4_4_ = fVar156 * fVar147;
        auVar108._8_4_ = fVar158 * fVar149;
        auVar108._12_4_ = fVar160 * fVar151;
        auVar51 = vsubps_avx(auVar69,auVar98);
        auVar123 = vsubps_avx(auVar108,auVar48);
        auVar50 = vandps_avx(auVar137,auVar98);
        auVar54 = vandps_avx(auVar137,auVar48);
        auVar50 = vcmpps_avx(auVar50,auVar54,1);
        auVar54 = vblendvps_avx(auVar123,auVar51,auVar50);
        fVar41 = auVar101._0_4_ * fVar154 + auVar54._0_4_ * fVar109 + auVar110._0_4_ * fVar169;
        fVar109 = auVar101._4_4_ * fVar157 + auVar54._4_4_ * fVar117 + auVar110._4_4_ * fVar172;
        fVar115 = auVar101._8_4_ * fVar159 + auVar54._8_4_ * fVar130 + auVar110._8_4_ * fVar174;
        fVar116 = auVar101._12_4_ * fVar16 + auVar54._12_4_ * fVar138 + auVar110._12_4_ * fVar176;
        auVar49._0_4_ = fVar41 + fVar41;
        auVar49._4_4_ = fVar109 + fVar109;
        auVar49._8_4_ = fVar115 + fVar115;
        auVar49._12_4_ = fVar116 + fVar116;
        fVar41 = auVar101._0_4_ * fVar3 + auVar54._0_4_ * fVar177 + auVar110._0_4_ * fVar2;
        fVar109 = auVar101._4_4_ * fVar57 + auVar54._4_4_ * fVar182 + auVar110._4_4_ * fVar39;
        fVar78 = auVar101._8_4_ * fVar80 + auVar54._8_4_ * fVar184 + auVar110._8_4_ * fVar78;
        fVar80 = auVar101._12_4_ * fVar10 + auVar54._12_4_ * fVar186 + auVar110._12_4_ * fVar9;
        auVar50 = vrcpps_avx(auVar49);
        fVar2 = auVar50._0_4_;
        auVar121._0_4_ = auVar49._0_4_ * fVar2;
        fVar3 = auVar50._4_4_;
        auVar121._4_4_ = auVar49._4_4_ * fVar3;
        fVar39 = auVar50._8_4_;
        auVar121._8_4_ = auVar49._8_4_ * fVar39;
        fVar57 = auVar50._12_4_;
        auVar121._12_4_ = auVar49._12_4_ * fVar57;
        auVar128._8_4_ = 0x3f800000;
        auVar128._0_8_ = &DAT_3f8000003f800000;
        auVar128._12_4_ = 0x3f800000;
        auVar50 = vsubps_avx(auVar128,auVar121);
        auVar70._0_4_ = (fVar41 + fVar41) * (fVar2 + fVar2 * auVar50._0_4_);
        auVar70._4_4_ = (fVar109 + fVar109) * (fVar3 + fVar3 * auVar50._4_4_);
        auVar70._8_4_ = (fVar78 + fVar78) * (fVar39 + fVar39 * auVar50._8_4_);
        auVar70._12_4_ = (fVar80 + fVar80) * (fVar57 + fVar57 * auVar50._12_4_);
        auVar50 = vcmpps_avx(auVar70,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar51 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar70,2);
        auVar50 = vandps_avx(auVar51,auVar50);
        auVar51 = vcmpps_avx(auVar49,_DAT_01feba10,4);
        auVar50 = vandps_avx(auVar51,auVar50);
        auVar50 = vpslld_avx(auVar50,0x1f);
        auVar51 = vpsrad_avx(auVar50,0x1f);
        auVar50 = auVar38 & auVar51;
        auVar38 = vandps_avx(auVar38,auVar51);
        if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar50[0xf] < '\0') {
          uStack_1800 = auVar96._8_8_;
          uStack_1820 = uStack_1800;
          local_1888 = auVar54;
          local_1878 = auVar110;
          local_1868 = auVar101;
          local_1858 = auVar70;
          local_1848 = auVar145;
          _local_1838 = auVar120;
          local_1828 = auVar96._0_8_;
        }
      }
      pGVar7 = (context->scene->geometries).items[uVar22].ptr;
      uVar4 = pGVar7->mask;
      auVar37._4_4_ = uVar4;
      auVar37._0_4_ = uVar4;
      auVar37._8_4_ = uVar4;
      auVar37._12_4_ = uVar4;
      auVar50 = vandps_avx(auVar37,*(undefined1 (*) [16])(ray + 0x90));
      auVar50 = vpcmpeqd_avx(auVar50,_DAT_01feba10);
      auVar54 = auVar38 & ~auVar50;
      if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar54[0xf] < '\0'
         ) {
        auVar38 = vandnps_avx(auVar50,auVar38);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar52._8_4_ = 0x7fffffff;
          auVar52._0_8_ = 0x7fffffff7fffffff;
          auVar52._12_4_ = 0x7fffffff;
          auVar50 = vandps_avx(local_1848,auVar52);
          auVar54 = vrcpps_avx(local_1848);
          fVar2 = auVar54._0_4_;
          auVar88._0_4_ = local_1848._0_4_ * fVar2;
          fVar3 = auVar54._4_4_;
          auVar88._4_4_ = local_1848._4_4_ * fVar3;
          fVar39 = auVar54._8_4_;
          auVar88._8_4_ = local_1848._8_4_ * fVar39;
          fVar57 = auVar54._12_4_;
          auVar88._12_4_ = local_1848._12_4_ * fVar57;
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = &DAT_3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar54 = vsubps_avx(auVar99,auVar88);
          auVar71._0_4_ = fVar2 + fVar2 * auVar54._0_4_;
          auVar71._4_4_ = fVar3 + fVar3 * auVar54._4_4_;
          auVar71._8_4_ = fVar39 + fVar39 * auVar54._8_4_;
          auVar71._12_4_ = fVar57 + fVar57 * auVar54._12_4_;
          auVar89._8_4_ = 0x219392ef;
          auVar89._0_8_ = 0x219392ef219392ef;
          auVar89._12_4_ = 0x219392ef;
          auVar50 = vcmpps_avx(auVar50,auVar89,5);
          auVar50 = vandps_avx(auVar50,auVar71);
          auVar72._0_4_ = auVar50._0_4_ * (float)local_1828;
          auVar72._4_4_ = auVar50._4_4_ * local_1828._4_4_;
          auVar72._8_4_ = auVar50._8_4_ * (float)uStack_1820;
          auVar72._12_4_ = auVar50._12_4_ * uStack_1820._4_4_;
          local_1738 = vminps_avx(auVar72,auVar99);
          auVar53._0_4_ = auVar50._0_4_ * (float)local_1838._0_4_;
          auVar53._4_4_ = auVar50._4_4_ * (float)local_1838._4_4_;
          auVar53._8_4_ = auVar50._8_4_ * fStack_1830;
          auVar53._12_4_ = auVar50._12_4_ * fStack_182c;
          local_1728 = vminps_avx(auVar53,auVar99);
          local_1708 = vpshufd_avx(ZEXT416(uVar22),0);
          local_1718 = vpshufd_avx(ZEXT416(*(uint *)(lVar27 + uVar26 * 4)),0);
          local_1768 = local_1868._0_8_;
          uStack_1760 = local_1868._8_8_;
          local_1758 = local_1878._0_8_;
          uStack_1750 = local_1878._8_8_;
          local_1748 = local_1888;
          vcmpps_avx(ZEXT1632(local_1728),ZEXT1632(local_1728),0xf);
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          uStack_16e8 = context->user->instPrimID[0];
          uStack_16e4 = uStack_16e8;
          uStack_16e0 = uStack_16e8;
          uStack_16dc = uStack_16e8;
          auVar50 = *(undefined1 (*) [16])(ray + 0x80);
          auVar54 = vblendvps_avx(auVar50,local_1858,auVar38);
          *(undefined1 (*) [16])(ray + 0x80) = auVar54;
          args.valid = (int *)local_19b8;
          args.geometryUserPtr = pGVar7->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_19b8 = auVar38;
          args.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar7->occlusionFilterN)(&args);
          }
          if (local_19b8 == (undefined1  [16])0x0) {
            auVar38 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar38 = auVar38 ^ _DAT_01febe20;
          }
          else {
            p_Var8 = context->args->filter;
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&args);
            }
            auVar54 = vpcmpeqd_avx((undefined1  [16])0x0,local_19b8);
            auVar38 = auVar54 ^ _DAT_01febe20;
            auVar73._8_4_ = 0xff800000;
            auVar73._0_8_ = 0xff800000ff800000;
            auVar73._12_4_ = 0xff800000;
            auVar54 = vblendvps_avx(auVar73,*(undefined1 (*) [16])(args.ray + 0x80),auVar54);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar54;
          }
          auVar54 = vpslld_avx(auVar38,0x1f);
          auVar38 = vpsrad_avx(auVar54,0x1f);
          auVar50 = vblendvps_avx(auVar50,*(undefined1 (*) [16])pRVar1,auVar54);
          *(undefined1 (*) [16])pRVar1 = auVar50;
        }
        auVar42 = vpandn_avx(auVar38,auVar42);
      }
      if (((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf])
         || (bVar32 = 2 < uVar26, uVar26 = uVar26 + 1, bVar32)) break;
    }
    auVar38 = vpand_avx(auVar42,auVar75);
    auVar42 = auVar75 & auVar42;
    if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf])
    break;
  }
  auVar75 = vpcmpeqd_avx(auVar75,auVar75);
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar38 ^ auVar75);
LAB_0031faf4:
  auVar56 = ZEXT1664(auVar75);
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar21.field_0,(undefined1  [16])terminated.field_0);
  auVar75 = auVar75 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar75[0xf]) {
LAB_0031fb2a:
    iVar23 = 3;
  }
  else {
    auVar56 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
    auVar74._8_4_ = 0xff800000;
    auVar74._0_8_ = 0xff800000ff800000;
    auVar74._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar74,
                       (undefined1  [16])terminated.field_0);
    iVar23 = 0;
  }
LAB_0031fb2d:
  if (iVar23 == 3) {
    auVar11 = vandps_avx(auVar11,(undefined1  [16])terminated.field_0);
    auVar55._8_4_ = 0xff800000;
    auVar55._0_8_ = 0xff800000ff800000;
    auVar55._12_4_ = 0xff800000;
    auVar11 = vmaskmovps_avx(auVar11,auVar55);
    *(undefined1 (*) [16])pRVar1 = auVar11;
    return;
  }
  goto LAB_0031eede;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }